

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O0

Sphere * anon_unknown.dwarf_20aaf::parseSphere(Sphere *__return_storage_ptr__,ifstream *file)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  char *pcVar4;
  void *pvVar5;
  invalid_argument *piVar6;
  char local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [48];
  string local_30 [8];
  string token;
  ifstream *file_local;
  
  (__return_storage_ptr__->center).x = 0.0;
  (__return_storage_ptr__->center).y = 0.0;
  (__return_storage_ptr__->center).z = 0.0;
  __return_storage_ptr__->radius = 0.0;
  (__return_storage_ptr__->color).r = '\0';
  (__return_storage_ptr__->color).g = '\0';
  (__return_storage_ptr__->color).b = '\0';
  __return_storage_ptr__->reflectionCoefficient = 0.0;
  std::__cxx11::string::string(local_30);
  while( true ) {
    piVar3 = std::operator>>((istream *)file,local_30);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    if (*pcVar4 == '#') {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)file,local_30);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"endSphere");
      if (bVar1) break;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"center");
      if (bVar1) {
        pvVar5 = (void *)std::istream::operator>>(file,(float *)__return_storage_ptr__);
        pvVar5 = (void *)std::istream::operator>>(pvVar5,&(__return_storage_ptr__->center).y);
        std::istream::operator>>(pvVar5,&(__return_storage_ptr__->center).z);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"radius");
        if (bVar1) {
          std::istream::operator>>(file,&__return_storage_ptr__->radius);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"color");
          if (bVar1) {
            operator>>((istream *)file,&__return_storage_ptr__->color);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"reflection");
            if (!bVar1) {
              piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::operator+(local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)"Unknown token \'");
              std::operator+(local_60,local_80);
              std::invalid_argument::invalid_argument(piVar6,(string *)local_60);
              __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            std::istream::operator>>(file,&__return_storage_ptr__->reflectionCoefficient);
          }
        }
      }
    }
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Invalid config file format.");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

Sphere parseSphere(std::ifstream& file)
{
  Sphere sphere{};
  std::string token;
  while (file >> token)
  {
    if (token[0] == '#') // comment, skip entire line
      std::getline(file, token);
    else if (token == "endSphere")
      break;
    else if (token == "center")
      file >> sphere.center.x >> sphere.center.y >> sphere.center.z;
    else if (token == "radius")
      file >> sphere.radius;
    else if (token == "color")
      file >> sphere.color;
    else if (token == "reflection")
      file >> sphere.reflectionCoefficient;
    else
      throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return sphere;
}